

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

void ps_parser_to_token_array
               (PS_Parser parser,T1_Token tokens,FT_UInt max_tokens,FT_Int *pnum_tokens)

{
  FT_Byte *pFVar1;
  FT_Byte *pFVar2;
  T1_Token pTVar3;
  undefined1 local_78 [8];
  T1_TokenRec master;
  T1_TokenRec token;
  
  *pnum_tokens = -1;
  ps_parser_to_token(parser,(T1_Token)local_78);
  if ((int)master.limit == 3) {
    pFVar1 = parser->cursor;
    pFVar2 = parser->limit;
    parser->cursor = (FT_Byte *)((long)local_78 + 1);
    parser->limit = master.start + -1;
    pTVar3 = tokens;
    do {
      if (parser->limit <= parser->cursor) break;
      ps_parser_to_token(parser,(T1_Token)&master.type);
      if ((int)token.limit != 0) {
        if (pTVar3 < tokens + max_tokens && tokens != (T1_Token)0x0) {
          *(ulong *)&pTVar3->type = CONCAT44(token.limit._4_4_,(int)token.limit);
          pTVar3->start = (FT_Byte *)master._16_8_;
          pTVar3->limit = token.start;
        }
        pTVar3 = pTVar3 + 1;
      }
    } while ((int)token.limit != 0);
    *pnum_tokens = (int)((ulong)((long)pTVar3 - (long)tokens) >> 3) * -0x55555555;
    parser->cursor = pFVar1;
    parser->limit = pFVar2;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_parser_to_token_array( PS_Parser  parser,
                            T1_Token   tokens,
                            FT_UInt    max_tokens,
                            FT_Int*    pnum_tokens )
  {
    T1_TokenRec  master;


    *pnum_tokens = -1;

    /* this also handles leading whitespace */
    ps_parser_to_token( parser, &master );

    if ( master.type == T1_TOKEN_TYPE_ARRAY )
    {
      FT_Byte*  old_cursor = parser->cursor;
      FT_Byte*  old_limit  = parser->limit;
      T1_Token  cur        = tokens;
      T1_Token  limit      = cur + max_tokens;


      /* don't include outermost delimiters */
      parser->cursor = master.start + 1;
      parser->limit  = master.limit - 1;

      while ( parser->cursor < parser->limit )
      {
        T1_TokenRec  token;


        ps_parser_to_token( parser, &token );
        if ( !token.type )
          break;

        if ( tokens && cur < limit )
          *cur = token;

        cur++;
      }

      *pnum_tokens = (FT_Int)( cur - tokens );

      parser->cursor = old_cursor;
      parser->limit  = old_limit;
    }
  }